

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.h
# Opt level: O3

void __thiscall
ScriptCompression::Unser<DataStream>(ScriptCompression *this,DataStream *s,CScript *script)

{
  uint uVar1;
  direct_or_indirect *pdVar2;
  uint uVar3;
  uint uVar4;
  size_t in_RCX;
  CScript *pCVar5;
  long in_FS_OFFSET;
  CompressedScript vch;
  uchar local_51;
  direct_or_indirect local_50;
  uint local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(s);
  if (uVar3 < 6) {
    uVar4 = GetSpecialScriptSize(uVar3);
    local_51 = '\0';
    prevector<33U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<33U,_unsigned_char,_unsigned_int,_int> *)&local_50.indirect_contents,uVar4
               ,&local_51);
    uVar4 = local_2c - 0x22;
    pdVar2 = (direct_or_indirect *)CONCAT71(local_50._1_7_,local_50.direct[0]);
    if (local_2c < 0x22) {
      uVar4 = local_2c;
      pdVar2 = &local_50;
    }
    DataStream::read(s,(int)pdVar2,(void *)(ulong)uVar4,in_RCX);
    DecompressScript(script,uVar3,(CompressedScript *)&local_50.indirect_contents);
    if (0x21 < local_2c) {
      free((void *)CONCAT71(local_50._1_7_,local_50.direct[0]));
    }
  }
  else {
    uVar3 = uVar3 - 6;
    if (uVar3 < 0x2711) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&script->super_CScriptBase,uVar3);
      uVar3 = (script->super_CScriptBase)._size;
      uVar4 = uVar3 - 0x1d;
      pCVar5 = *(CScript **)&(script->super_CScriptBase)._union;
      if (uVar3 < 0x1d) {
        uVar4 = uVar3;
        pCVar5 = script;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        DataStream::read(s,(int)pCVar5,(void *)(ulong)uVar4,in_RCX);
        return;
      }
      goto LAB_00338594;
    }
    uVar4 = (script->super_CScriptBase)._size;
    uVar1 = uVar4 - 0x1d;
    if (uVar4 < 0x1d) {
      uVar1 = uVar4;
    }
    pCVar5 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar4 < 0x1d) {
      pCVar5 = script;
    }
    local_50.direct[0] = 'j';
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (&script->super_CScriptBase,
               (uchar *)((long)&(pCVar5->super_CScriptBase)._union + (long)(int)uVar1),
               (uchar *)local_50.direct);
    DataStream::ignore(s,(ulong)uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00338594:
  __stack_chk_fail();
}

Assistant:

void Unser(Stream &s, CScript& script) {
        unsigned int nSize = 0;
        s >> VARINT(nSize);
        if (nSize < nSpecialScripts) {
            CompressedScript vch(GetSpecialScriptSize(nSize), 0x00);
            s >> Span{vch};
            DecompressScript(script, nSize, vch);
            return;
        }
        nSize -= nSpecialScripts;
        if (nSize > MAX_SCRIPT_SIZE) {
            // Overly long script, replace with a short invalid one
            script << OP_RETURN;
            s.ignore(nSize);
        } else {
            script.resize(nSize);
            s >> Span{script};
        }
    }